

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_ObjAttrSize(Cba_Ntk_t *p,int i)

{
  int iVar1;
  
  if (i < 0) {
    __assert_fail("i>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0xf3,"int Cba_ObjAttrSize(Cba_Ntk_t *, int)");
  }
  if ((p->vObjAttr).nSize < 1) {
    return 0;
  }
  Vec_IntFillExtra(&p->vObjAttr,i + 1,0);
  if (i < (p->vObjAttr).nSize) {
    if ((p->vObjAttr).pArray[(uint)i] == 0) {
      return 0;
    }
    Vec_IntFillExtra(&p->vObjAttr,i + 1,0);
    if (i < (p->vObjAttr).nSize) {
      iVar1 = (p->vObjAttr).pArray[(uint)i];
      if ((-1 < (long)iVar1) && (iVar1 < (p->vAttrSto).nSize)) {
        return (p->vAttrSto).pArray[iVar1];
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int            Cba_ObjAttrSize( Cba_Ntk_t * p, int i )         { assert(i>=0); return Cba_ObjAttr(p, i) ? Vec_IntEntry(&p->vAttrSto, Cba_ObjAttr(p, i)) : 0; }